

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_or.hpp
# Opt level: O0

void __thiscall
pstore::error_or<pstore::romfs::descriptor>::error_or<pstore::romfs::descriptor,void>
          (error_or<pstore::romfs::descriptor> *this,descriptor *other)

{
  storage_type *this_00;
  descriptor *other_local;
  error_or<pstore::romfs::descriptor> *this_local;
  
  this->has_error_ = false;
  this_00 = get_storage(this);
  pstore::romfs::descriptor::descriptor(this_00,other);
  return;
}

Assistant:

explicit error_or (Other && other)
                : has_error_{false} {
            new (get_storage ()) storage_type (std::forward<Other> (other));
        }